

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.h
# Opt level: O2

void __thiscall TPZEquationFilter::Filter(TPZEquationFilter *this,TPZVec<long> *dest)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if ((this->fDestIndices).fNElements != 0) {
    plVar1 = dest->fStore;
    plVar2 = (this->fDestIndices).fStore;
    lVar4 = 0;
    lVar5 = dest->fNElements;
    if (dest->fNElements < 1) {
      lVar5 = lVar4;
    }
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
      lVar3 = plVar2[plVar1[lVar6]];
      if (lVar3 != -1) {
        plVar1[lVar4] = lVar3;
        lVar4 = lVar4 + 1;
      }
    }
    (*dest->_vptr_TPZVec[3])(dest,lVar4,lVar5,dest->_vptr_TPZVec[3]);
    return;
  }
  return;
}

Assistant:

void Filter(TPZVec<int64_t> &dest) const
    {
        if (fDestIndices.size() == 0) {
            return;
        }
        else{
            int64_t count = 0;
            int64_t numeq = dest.size();
            for (int64_t i=0; i<numeq; i++) {
                if (fDestIndices[dest[i]] != -1) {
                    dest[count] = fDestIndices[dest[i]];
                    count++;
                }
            }
            dest.Resize(count);
        }
    }